

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

optional<pbrt::ShapeSample> * __thiscall
pbrt::Cylinder::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,Cylinder *this,Point2f *u)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  Transform *this_00;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar13 [64];
  undefined1 auVar16 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Normal3<float> NVar20;
  Point3fi pi;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  Point3fi local_88;
  Tuple3<pbrt::Normal3,_float> local_70;
  Point3fi local_60;
  Tuple3<pbrt::Vector3,_float> local_48;
  Point3f local_38;
  undefined1 extraout_var [60];
  
  fVar17 = (u->super_Tuple2<pbrt::Point2,_float>).x;
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * this->zMax)),ZEXT416((uint)(1.0 - fVar17)),
                            ZEXT416((uint)this->zMin));
  fVar17 = (u->super_Tuple2<pbrt::Point2,_float>).y * this->phiMax;
  auVar7._0_4_ = this->radius;
  auVar7._4_4_ = this->zMin;
  auVar7._8_4_ = this->zMax;
  auVar7._12_4_ = this->phiMax;
  fVar9 = cosf(fVar17);
  auVar8 = vinsertps_avx(auVar7,ZEXT416((uint)this->radius),0x10);
  auVar13._0_4_ = sinf(fVar17);
  auVar13._4_60_ = extraout_var;
  auVar6._4_4_ = extraout_XMM0_Db;
  auVar6._0_4_ = fVar9;
  auVar6._8_4_ = extraout_XMM0_Dc;
  auVar6._12_4_ = extraout_XMM0_Dd;
  auVar5 = vinsertps_avx(auVar6,auVar13._0_16_,0x10);
  local_a8 = auVar8._0_4_;
  fStack_a4 = auVar8._4_4_;
  fStack_a0 = auVar8._8_4_;
  fStack_9c = auVar8._12_4_;
  auVar10._0_4_ = auVar5._0_4_ * local_a8;
  auVar10._4_4_ = auVar5._4_4_ * fStack_a4;
  auVar10._8_4_ = auVar5._8_4_ * fStack_a0;
  auVar10._12_4_ = auVar5._12_4_ * fStack_9c;
  auVar18._0_4_ = auVar10._0_4_ * auVar10._0_4_;
  auVar18._4_4_ = auVar10._4_4_ * auVar10._4_4_;
  auVar18._8_4_ = auVar10._8_4_ * auVar10._8_4_;
  auVar18._12_4_ = auVar10._12_4_ * auVar10._12_4_;
  auVar8 = vmovshdup_avx(auVar18);
  auVar8 = vfmadd231ss_fma(auVar8,auVar10,auVar10);
  auVar8 = vsqrtss_avx(auVar8,auVar8);
  fVar17 = this->radius / auVar8._0_4_;
  auVar11._0_4_ = auVar10._0_4_ * fVar17;
  auVar11._4_4_ = auVar10._4_4_ * fVar17;
  auVar11._8_4_ = auVar10._8_4_ * fVar17;
  auVar11._12_4_ = auVar10._12_4_ * fVar17;
  local_38.super_Tuple3<pbrt::Point3,_float>.y = (float)vextractps_avx(auVar11,1);
  auVar8._8_4_ = 0x7fffffff;
  auVar8._0_8_ = 0x7fffffff7fffffff;
  auVar8._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx512vl(auVar11,auVar8);
  auVar5._8_4_ = 0x34400002;
  auVar5._0_8_ = 0x3440000234400002;
  auVar5._12_4_ = 0x34400002;
  auVar8 = vmulps_avx512vl(auVar8,auVar5);
  local_48._0_8_ = vmovlps_avx(auVar8);
  local_48.z = 0.0;
  this_00 = this->renderFromObject;
  local_38.super_Tuple3<pbrt::Point3,_float>.x = auVar11._0_4_;
  local_38.super_Tuple3<pbrt::Point3,_float>.z = auVar12._0_4_;
  Point3fi::Point3fi(&local_60,&local_38,(Vector3f *)&local_48);
  Transform::operator()(&local_88,this_00,&local_60);
  local_70.y = local_38.super_Tuple3<pbrt::Point3,_float>.y;
  local_70.x = local_38.super_Tuple3<pbrt::Point3,_float>.x;
  auVar16 = ZEXT856(0);
  local_70.z = 0.0;
  NVar20 = Transform::operator()(this->renderFromObject,(Normal3<float> *)&local_70);
  local_60.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
  .low = NVar20.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar14._0_8_ = NVar20.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar14._8_56_ = auVar16;
  local_60.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x
       = (Interval<float>)vmovlps_avx(auVar14._0_16_);
  NVar20 = Normalize<float>((Normal3<float> *)&local_60);
  auVar15._0_8_ = NVar20.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar15._8_56_ = auVar16;
  auVar12 = auVar15._0_16_;
  bVar4 = this->reverseOrientation;
  if (bVar4 != false) {
    auVar12._0_8_ = auVar15._0_8_ ^ 0x8000000080000000;
    auVar12._8_4_ = auVar16._0_4_ ^ 0x80000000;
    auVar12._12_4_ = auVar16._4_4_ ^ 0x80000000;
  }
  *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
       local_88.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
  (__return_storage_ptr__->optionalValue).__align =
       (anon_struct_8_0_00000001_for___align)
       local_88.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
  *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 8) =
       local_88.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
  fVar17 = this->zMax;
  fVar9 = this->zMin;
  fVar1 = this->radius;
  fVar2 = this->phiMax;
  __return_storage_ptr__->set = true;
  auVar19._0_12_ = ZEXT812(0);
  auVar19._12_4_ = 0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x18) = auVar19;
  uVar3 = vmovlps_avx(auVar12);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar3;
  *(uint *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
       (uint)(bVar4 & 1) * (int)-NVar20.super_Tuple3<pbrt::Normal3,_float>.z +
       (uint)!(bool)(bVar4 & 1) * (int)NVar20.super_Tuple3<pbrt::Normal3,_float>.z;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x34) = 0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) = auVar19;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) =
       1.0 / ((fVar17 - fVar9) * fVar1 * fVar2);
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(const Point2f &u) const {
        Float z = Lerp(u[0], zMin, zMax);
        Float phi = u[1] * phiMax;
        // Compute cylinder sample position _pi_ and normal _n_ from $z$ and $\phi$
        Point3f pObj = Point3f(radius * std::cos(phi), radius * std::sin(phi), z);
        // Reproject _pObj_ to cylinder surface and compute _pObjError_
        Float hitRad = std::sqrt(pObj.x * pObj.x + pObj.y * pObj.y);
        pObj.x *= radius / hitRad;
        pObj.y *= radius / hitRad;
        Vector3f pObjError = gamma(3) * Abs(Vector3f(pObj.x, pObj.y, 0));

        Point3fi pi = (*renderFromObject)(Point3fi(pObj, pObjError));
        Normal3f n = Normalize((*renderFromObject)(Normal3f(pObj.x, pObj.y, 0)));
        if (reverseOrientation)
            n *= -1;

        return ShapeSample{Interaction(pi, n), 1 / Area()};
    }